

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdbfile.cpp
# Opt level: O3

void ProcessSymbol(ImageSectionStream *imageSectionStream,Record *record,RVAToSymbolMap *toMap)

{
  char *pcVar1;
  SymbolRecordKind SVar2;
  ushort oneBasedSectionIndex;
  uint32_t offsetInSection;
  __hashtable *__h;
  PDBSymbol symbol;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  uint32_t local_80;
  uint32_t uStack_7c;
  undefined8 uStack_78;
  uint32_t local_70;
  uint32_t local_68;
  long *local_60 [2];
  long local_50 [2];
  uint32_t local_40;
  uint32_t uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  uint32_t local_30;
  
  local_98 = 0;
  local_90 = 0;
  local_80 = 0;
  uStack_7c = 0;
  uStack_78 = 0;
  local_70 = 0;
  SVar2 = (record->header).kind;
  offsetInSection = 0;
  oneBasedSectionIndex = 0;
  local_a0 = &local_90;
  switch(SVar2) {
  case S_LDATA32:
    pcVar1 = (char *)((long)&(record->data).S_FRAMEPROC.offPad + 2);
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)pcVar1);
    if (local_98 == 0) {
      offsetInSection = uStack_78._4_4_;
      oneBasedSectionIndex = (uint16_t)uStack_78;
      goto switchD_0010ba50_caseD_1111;
    }
    break;
  case S_GDATA32:
    pcVar1 = (char *)((long)&(record->data).S_FRAMEPROC.offPad + 2);
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)pcVar1);
    break;
  case S_PUB32:
    offsetInSection = 0;
    oneBasedSectionIndex = 0;
    if (((record->data).S_ENVBLOCK.flags & 2) != 0) {
      pcVar1 = (char *)((long)&(record->data).S_FRAMEPROC.offPad + 2);
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)pcVar1);
      oneBasedSectionIndex = (record->data).S_PUB32.section;
      offsetInSection = (record->data).S_FRAMEPROC.cbPad;
      uStack_78 = CONCAT44(offsetInSection,(uint)oneBasedSectionIndex);
    }
    goto switchD_0010ba50_caseD_1111;
  case S_LPROC32:
    strlen(&record->field_0x27);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)&record->field_0x27);
    goto LAB_0010bbf7;
  case S_GPROC32:
    strlen(&record->field_0x27);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)&record->field_0x27);
    goto LAB_0010bbf7;
  case S_REGREL32:
    goto switchD_0010ba50_caseD_1111;
  case S_LTHREAD32:
    pcVar1 = (char *)((long)&(record->data).S_FRAMEPROC.offPad + 2);
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)pcVar1);
    break;
  case S_GTHREAD32:
    pcVar1 = (char *)((long)&(record->data).S_FRAMEPROC.offPad + 2);
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)pcVar1);
    break;
  default:
    if (SVar2 == S_LPROC32_ID) {
      strlen(&record->field_0x27);
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)&record->field_0x27);
    }
    else {
      offsetInSection = 0;
      if (SVar2 != S_GPROC32_ID) goto switchD_0010ba50_caseD_1111;
      strlen(&record->field_0x27);
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)&record->field_0x27);
    }
LAB_0010bbf7:
    oneBasedSectionIndex = (record->data).S_LPROC32.section;
    offsetInSection = (record->data).S_LPROC32.offset;
    uStack_78 = CONCAT44(offsetInSection,(uint)oneBasedSectionIndex);
    uStack_7c = (record->data).S_FRAMEPROC.cbSaveRegs;
    goto switchD_0010ba50_caseD_1111;
  }
  oneBasedSectionIndex = (record->data).S_PUB32.section;
  offsetInSection = (record->data).S_FRAMEPROC.cbPad;
  uStack_78 = CONCAT44(offsetInSection,(uint)oneBasedSectionIndex);
  local_70 = (record->data).S_FRAMEPROC.cbFrame;
switchD_0010ba50_caseD_1111:
  local_80 = PDB::ImageSectionStream::ConvertSectionOffsetToRVA
                       (imageSectionStream,oneBasedSectionIndex,offsetInSection);
  if (local_80 != 0) {
    local_68 = local_80;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>((string *)local_60,local_a0,local_a0 + local_98);
    local_30 = local_70;
    local_40 = local_80;
    uStack_3c = uStack_7c;
    uStack_38 = (undefined4)uStack_78;
    uStack_34 = uStack_78._4_4_;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,PDBSymbol>,std::allocator<std::pair<unsigned_int_const,PDBSymbol>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int_const,PDBSymbol>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,PDBSymbol>,std::allocator<std::pair<unsigned_int_const,PDBSymbol>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)toMap);
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return;
}

Assistant:

static void ProcessSymbol(const PDB::ImageSectionStream& imageSectionStream, const PDB::CodeView::DBI::Record* record, RVAToSymbolMap& toMap)
{
    PDBSymbol symbol;
    if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_PUB32)
    {
        if (PDB_AS_UNDERLYING(record->data.S_PUB32.flags) & PDB_AS_UNDERLYING(PDB::CodeView::DBI::PublicSymbolFlags::Function))
        {
            symbol.name = record->data.S_PUB32.name;
            symbol.section = record->data.S_PUB32.section;
            symbol.offset = record->data.S_PUB32.offset;
        }
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LPROC32)
    {
        symbol.name = record->data.S_LPROC32.name;
        symbol.section = record->data.S_LPROC32.section;
        symbol.offset = record->data.S_LPROC32.offset;
        symbol.length = record->data.S_LPROC32.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GPROC32)
    {
        symbol.name = record->data.S_GPROC32.name;
        symbol.section = record->data.S_GPROC32.section;
        symbol.offset = record->data.S_GPROC32.offset;
        symbol.length = record->data.S_GPROC32.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LPROC32_ID)
    {
        symbol.name = record->data.S_LPROC32_ID.name;
        symbol.section = record->data.S_LPROC32_ID.section;
        symbol.offset = record->data.S_LPROC32_ID.offset;
        symbol.length = record->data.S_LPROC32_ID.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GPROC32_ID)
    {
        symbol.name = record->data.S_GPROC32_ID.name;
        symbol.section = record->data.S_GPROC32_ID.section;
        symbol.offset = record->data.S_GPROC32_ID.offset;
        symbol.length = record->data.S_GPROC32_ID.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LDATA32)
    {
        symbol.name = record->data.S_LDATA32.name;
        // Often there are LDATA32 symbols without a name that are same size as function entries? Skip those.
        if (!symbol.name.empty())
        {
            symbol.section = record->data.S_LDATA32.section;
            symbol.offset = record->data.S_LDATA32.offset;
            symbol.typeIndex = record->data.S_LDATA32.typeIndex;
        }
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GDATA32)
    {
        symbol.name = record->data.S_GDATA32.name;
        symbol.section = record->data.S_GDATA32.section;
        symbol.offset = record->data.S_GDATA32.offset;
        symbol.typeIndex = record->data.S_GDATA32.typeIndex;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LTHREAD32)
    {
        symbol.name = record->data.S_LTHREAD32.name;
        symbol.section = record->data.S_LTHREAD32.section;
        symbol.offset = record->data.S_LTHREAD32.offset;
        symbol.typeIndex = record->data.S_LTHREAD32.typeIndex;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GTHREAD32)
    {
        symbol.name = record->data.S_GTHREAD32.name;
        symbol.section = record->data.S_GTHREAD32.section;
        symbol.offset = record->data.S_GTHREAD32.offset;
        symbol.typeIndex = record->data.S_GTHREAD32.typeIndex;
    }
    symbol.rva = imageSectionStream.ConvertSectionOffsetToRVA(symbol.section, symbol.offset);
    if (symbol.rva == 0u)
    {
        // certain symbols (e.g. control-flow guard symbols) don't have a valid RVA, ignore those
        return;
    }

    toMap.insert({ symbol.rva, symbol });
}